

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O2

Matrix * MatrixRotate(Matrix *__return_storage_ptr__,Vector3 axis,float angle)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 local_48;
  float local_38;
  float local_28;
  
  local_28 = axis.z;
  fVar1 = axis.x;
  fVar2 = axis.y;
  local_38 = fVar2 * fVar2;
  fVar3 = local_28 * local_28 + fVar1 * fVar1 + local_38;
  if (((fVar3 == 1.0) && (!NAN(fVar3))) || ((fVar3 == 0.0 && (!NAN(fVar3))))) {
    local_48 = axis._0_8_;
  }
  else {
    fVar3 = 1.0 / SQRT(fVar3);
    local_28 = local_28 * fVar3;
    fVar2 = fVar2 * fVar3;
    local_48 = CONCAT44(fVar2,fVar1 * fVar3);
    local_38 = fVar2 * fVar2;
  }
  fVar1 = sinf(angle);
  fVar2 = cosf(angle);
  fVar3 = 1.0 - fVar2;
  __return_storage_ptr__->m0 = (float)local_48 * (float)local_48 * fVar3 + fVar2;
  __return_storage_ptr__->m4 = (float)local_48 * local_48._4_4_ * fVar3 + -(local_28 * fVar1);
  __return_storage_ptr__->m1 = (float)local_48 * local_48._4_4_ * fVar3 + local_28 * fVar1;
  __return_storage_ptr__->m5 = local_38 * fVar3 + fVar2;
  __return_storage_ptr__->m2 = fVar3 * local_28 * (float)local_48 + -(local_48._4_4_ * fVar1);
  __return_storage_ptr__->m6 = fVar3 * local_28 * local_48._4_4_ + fVar1 * (float)local_48;
  __return_storage_ptr__->m8 = local_28 * (float)local_48 * fVar3 + local_48._4_4_ * fVar1;
  __return_storage_ptr__->m9 = local_28 * local_48._4_4_ * fVar3 - fVar1 * (float)local_48;
  __return_storage_ptr__->m10 = local_28 * local_28 * fVar3 + fVar2;
  __return_storage_ptr__->m12 = 0.0;
  __return_storage_ptr__->m13 = 0.0;
  __return_storage_ptr__->m14 = 0.0;
  __return_storage_ptr__->m3 = 0.0;
  __return_storage_ptr__->m7 = 0.0;
  __return_storage_ptr__->m11 = 0.0;
  __return_storage_ptr__->m15 = 1.0;
  return __return_storage_ptr__;
}

Assistant:

RMDEF Matrix MatrixRotate(Vector3 axis, float angle)
{
    Matrix result = { 0 };

    float x = axis.x, y = axis.y, z = axis.z;

    float lengthSquared = x*x + y*y + z*z;

    if ((lengthSquared != 1.0f) && (lengthSquared != 0.0f))
    {
        float inverseLength = 1.0f/sqrtf(lengthSquared);
        x *= inverseLength;
        y *= inverseLength;
        z *= inverseLength;
    }

    float sinres = sinf(angle);
    float cosres = cosf(angle);
    float t = 1.0f - cosres;

    result.m0  = x*x*t + cosres;
    result.m1  = y*x*t + z*sinres;
    result.m2  = z*x*t - y*sinres;
    result.m3  = 0.0f;

    result.m4  = x*y*t - z*sinres;
    result.m5  = y*y*t + cosres;
    result.m6  = z*y*t + x*sinres;
    result.m7  = 0.0f;

    result.m8  = x*z*t + y*sinres;
    result.m9  = y*z*t - x*sinres;
    result.m10 = z*z*t + cosres;
    result.m11 = 0.0f;

    result.m12 = 0.0f;
    result.m13 = 0.0f;
    result.m14 = 0.0f;
    result.m15 = 1.0f;

    return result;
}